

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall
cs::struct_builder::struct_builder
          (struct_builder *this,context_t *c,string *name,tree_type<cs::token_base_*> *parent,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *method)

{
  string *in_RDX;
  long in_RDI;
  string *this_00;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *this_01;
  shared_ptr<cs::context_type> *in_stack_ffffffffffffff78;
  shared_ptr<cs::context_type> *in_stack_ffffffffffffff80;
  type_index local_30 [6];
  
  std::shared_ptr<cs::context_type>::shared_ptr(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)
  ;
  std::type_index::type_index(local_30,(type_info *)&structure::typeinfo);
  mCount = mCount + 1;
  type_id::type_id((type_id *)(in_RDI + 0x10),local_30,mCount);
  this_00 = (string *)(in_RDI + 0x20);
  std::__cxx11::string::string(this_00,in_RDX);
  this_01 = (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)(in_RDI + 0x40);
  tree_type<cs::token_base_*>::tree_type
            ((tree_type<cs::token_base_*> *)this_01,(tree_type<cs::token_base_*> *)this_00);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            (this_01,(deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)this_00);
  return;
}

Assistant:

struct_builder(context_t c, std::string name, tree_type<token_base *> parent,
		               std::deque<statement_base *> method) : mContext(std::move(c)),
			mTypeId(typeid(structure), ++mCount),
			mName(std::move(name)),
			mParent(std::move(parent)),
			mMethod(std::move(method)) {}